

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

SpatialSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  char cVar5;
  unsigned_long __i0;
  long lVar6;
  runtime_error *this_00;
  Vec3fa *pVVar7;
  long lVar8;
  SpatialBinInfo<16UL,_embree::PrimRef> *__return_storage_ptr___00;
  SpatialBinInfo<16UL,_embree::PrimRef> *range;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar18;
  float fVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  SpatialBinMapping<16UL> mapping;
  task_group_context context;
  SpatialBinner binner;
  task_group_context *in_stack_ffffffffffffee40;
  undefined1 local_1181 [17];
  HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
  *local_1170;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_1168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1160;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1150;
  uint local_1140;
  uint uStack_113c;
  uint uStack_1138;
  uint uStack_1134;
  undefined1 local_1130 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1120;
  undefined8 local_1110;
  task_group_context local_1100;
  SpatialBinInfo<16UL,_embree::PrimRef> local_1080;
  SpatialBinInfo<16UL,_embree::PrimRef> local_880;
  
  lVar6 = 0x700;
  pVVar7 = &local_1080.bounds[0][2].upper;
  do {
    *(undefined8 *)&(((BBox3fa *)(pVVar7 + -1))->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(((BBox3fa *)(pVVar7 + -1))->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&pVVar7->field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&pVVar7->field_0 + 8) = 0xff800000ff800000;
    *(undefined8 *)(pVVar7 + -3) = 0x7f8000007f800000;
    *(undefined8 *)((long)(pVVar7 + -3) + 8) = 0x7f8000007f800000;
    *(undefined8 *)(pVVar7 + -2) = 0xff800000ff800000;
    *(undefined8 *)((long)(pVVar7 + -2) + 8) = 0xff800000ff800000;
    *(undefined8 *)(pVVar7 + -5) = 0x7f8000007f800000;
    *(undefined8 *)((long)(pVVar7 + -5) + 8) = 0x7f8000007f800000;
    *(undefined8 *)(pVVar7 + -4) = 0xff800000ff800000;
    *(undefined8 *)((long)(pVVar7 + -4) + 8) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar6) = 0;
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar6 + 8) = 0;
    *(undefined8 *)(local_1181 + lVar6 + 1) = 0;
    *(undefined8 *)(local_1181 + lVar6 + 9) = 0;
    pVVar7 = pVVar7 + 6;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x800);
  local_1150.v[0] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
  local_1150.v[1] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
  local_1150.v[2] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
  local_1150.v[3] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3];
  pVVar7 = &(set->super_CentGeomBBox3fa).geomBounds.upper;
  fVar11 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
  fVar12 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3];
  auVar16._0_8_ =
       *(ulong *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 & 0x7fffffff7fffffff;
  auVar16._8_4_ = ABS(local_1150.v[2]);
  auVar16._12_4_ = ABS(local_1150.v[3]);
  auVar13._0_8_ = *(ulong *)&pVVar7->field_0 & 0x7fffffff7fffffff;
  auVar13._8_4_ = ABS(fVar11);
  auVar13._12_4_ = ABS(fVar12);
  auVar17 = maxps(auVar16,auVar13);
  fVar15 = auVar17._0_4_ * 1.5258789e-05;
  fVar18 = auVar17._4_4_ * 1.5258789e-05;
  auVar14._4_4_ = fVar18;
  auVar14._0_4_ = fVar15;
  fVar19 = auVar17._8_4_ * 1.5258789e-05;
  fVar20 = auVar17._12_4_ * 1.5258789e-05;
  fVar9 = (pVVar7->field_0).m128[0] - local_1150.v[0];
  fVar10 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1] - local_1150.v[1];
  fVar11 = fVar11 - local_1150.v[2];
  fVar12 = fVar12 - local_1150.v[3];
  auVar14._8_4_ = fVar19;
  auVar14._12_4_ = fVar20;
  auVar17._4_4_ = fVar10;
  auVar17._0_4_ = fVar9;
  auVar17._8_4_ = fVar11;
  auVar17._12_4_ = fVar12;
  auVar17 = maxps(auVar14,auVar17);
  auVar17 = divps(_DAT_01f7bb50,auVar17);
  local_1140 = -(uint)(fVar15 < fVar9) & auVar17._0_4_;
  uStack_113c = -(uint)(fVar18 < fVar10) & auVar17._4_4_;
  uStack_1138 = -(uint)(fVar19 < fVar11) & auVar17._8_4_;
  uStack_1134 = -(uint)(fVar20 < fVar12) & auVar17._12_4_;
  local_1168 = &local_1150;
  auVar3._4_4_ = uStack_113c;
  auVar3._0_4_ = local_1140;
  auVar3._8_4_ = uStack_1138;
  auVar3._12_4_ = uStack_1134;
  local_1130 = divps(_DAT_01f7ba10,auVar3);
  local_1100.my_version = proxy_support;
  local_1100.my_traits = (context_traits)0x4;
  local_1100.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_1100.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_1100.my_name = CUSTOM_CTX;
  local_1181._9_4_ =
       (undefined4)(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  puVar1 = (undefined8 *)
           ((long)&(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin + 4)
  ;
  local_1181._5_4_ = *(undefined4 *)puVar1;
  local_1181._1_4_ = (undefined4)((ulong)*puVar1 >> 0x20);
  local_1181._13_4_ = local_1181._5_4_;
  local_1170 = this;
  tbb::detail::r1::initialize(&local_1100);
  local_1120._0_8_ = CONCAT44(local_1181._5_4_,local_1181._1_4_);
  local_1120._8_8_ = CONCAT44(local_1181._13_4_,local_1181._9_4_);
  local_1110 = 0x400;
  local_1160._0_8_ = local_1181;
  __return_storage_ptr___00 = &local_880;
  range = &local_1080;
  local_1160._8_8_ = &local_1170;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>,embree::parallel_reduce<unsigned_long,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>
            (__return_storage_ptr___00,(d1 *)&local_1120.field_1,
             (blocked_range<unsigned_long> *)range,
             (SpatialBinInfo<16UL,_embree::PrimRef> *)&local_1160.field_1,
             (anon_class_16_2_ed117de8_conflict6 *)local_1160._0_8_,
             (anon_class_1_0_00000001 *)&local_1100,in_stack_ffffffffffffee40);
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_1100);
  if (cVar5 == '\0') {
    tbb::detail::r1::destroy(&local_1100);
    lVar6 = 0;
    do {
      lVar8 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)(__return_storage_ptr___00->bounds + -1) + 0x50 + lVar8);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)(range->bounds + -1) + 0x50 + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar2 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->bounds[0][0].lower.field_0 + lVar8);
        uVar4 = puVar2[1];
        puVar1 = (undefined8 *)((long)&range->bounds[0][0].lower.field_0 + lVar8);
        *puVar1 = *puVar2;
        puVar1[1] = uVar4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x70);
      lVar6 = lVar6 + 1;
      __return_storage_ptr___00 =
           (SpatialBinInfo<16UL,_embree::PrimRef> *)(__return_storage_ptr___00->bounds + 1);
      range = (SpatialBinInfo<16UL,_embree::PrimRef> *)(range->bounds + 1);
    } while (lVar6 != 0x10);
    memcpy(local_1080.numBegin,local_880.numBegin,0x100);
    memcpy(local_1080.numEnd,local_880.numEnd,0x100);
    SpatialBinInfo<16UL,_embree::PrimRef>::best
              (__return_storage_ptr__,&local_1080,(SpatialBinMapping<16UL> *)&local_1150,
               logBlockSize);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty);
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          const SpatialBinMapping<SPATIAL_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> SpatialBinner { 
                                     SpatialBinner binner(empty); 
                                     binner.bin2(splitterFactory,prims0,r.begin(),r.end(),_mapping);
                                     return binner; },
                                   [&] (const SpatialBinner& b0, const SpatialBinner& b1) -> SpatialBinner { return SpatialBinner::reduce(b0,b1); });
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }